

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void pack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
              size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
              size_t *p_index)

{
  int *piVar1;
  double *pdVar2;
  double *pdVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  particle *ppVar18;
  particle *ppVar19;
  pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  
  pdVar3 = *(double **)
            (*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                 .super__Head_base<0UL,_spatial_region_*,_false>.
                                                 _M_head_impl + 0x218) + (long)i * 8) + (long)j * 8)
            + (long)k * 0x10);
  sVar4 = *pn_index;
  (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[sVar4] = 0;
  while (pdVar3 != (double *)0x0) {
    ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar22 = *p_index;
    uVar21 = ((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVar20 >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (uVar21 < uVar22 || uVar21 - uVar22 == 0) {
      std::vector<particle,_std::allocator<particle>_>::resize(particles,uVar21 + 1 + (uVar21 >> 1))
      ;
      uVar22 = *p_index;
      ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    *p_index = uVar22 + 1;
    dVar5 = *pdVar3;
    dVar6 = pdVar3[1];
    dVar7 = pdVar3[2];
    dVar8 = pdVar3[3];
    dVar9 = pdVar3[4];
    dVar10 = pdVar3[5];
    dVar11 = pdVar3[6];
    dVar12 = pdVar3[7];
    dVar13 = pdVar3[6];
    dVar14 = pdVar3[7];
    dVar15 = pdVar3[8];
    dVar16 = pdVar3[9];
    dVar17 = pdVar3[10];
    ppVar18 = (particle *)pdVar3[0xb];
    ppVar19 = (particle *)pdVar3[0xc];
    pdVar2 = &ppVar20[uVar22].uz;
    *pdVar2 = pdVar3[5];
    pdVar2[1] = dVar13;
    pdVar2[2] = dVar14;
    pdVar2[3] = dVar15;
    pdVar2[4] = dVar16;
    pdVar2[5] = dVar17;
    pdVar2[6] = (double)ppVar18;
    pdVar2[7] = (double)ppVar19;
    ppVar20 = ppVar20 + uVar22;
    ppVar20->x = dVar5;
    ppVar20->y = dVar6;
    ppVar20->z = dVar7;
    ppVar20->ux = dVar8;
    ppVar20->uy = dVar9;
    ppVar20->uz = dVar10;
    ppVar20->g = dVar11;
    ppVar20->q = dVar12;
    sVar4 = *pn_index;
    pdVar3 = (double *)pdVar3[0xb];
    piVar1 = (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + sVar4;
    *piVar1 = *piVar1 + 1;
  }
  *pn_index = sVar4 + 1;
  return;
}

Assistant:

void pack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = psr->cp[i][j][k].pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}